

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void cs_impl::fiber::entry(void)

{
  int iVar1;
  long lVar2;
  vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_> *this;
  reference ppRVar3;
  Routine *routine;
  routine_t id;
  value_type this_00;
  
  lVar2 = ordinator();
  iVar1 = *(int *)(lVar2 + 0x30);
  this = (vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_> *)
         ordinator();
  ppRVar3 = std::vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_>::
            operator[](this,(ulong)(iVar1 - 1));
  this_00 = *ppRVar3;
  if (this_00 != (value_type)0x0) {
    std::function<void_()>::operator()((function<void_()> *)this_00);
    this_00->finished = true;
    lVar2 = ordinator();
    *(undefined4 *)(lVar2 + 0x30) = 0;
    cs::current_process = *(undefined **)&((_Function_base *)&this_00->this_context)->_M_functor;
    return;
  }
  __assert_fail("routine != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/system/./unix/common.cpp"
                ,0x14b,"void cs_impl::fiber::entry()");
}

Assistant:

void entry()
		{
			routine_t id = ordinator.current;
			Routine *routine = ordinator.routines[id - 1];
			assert(routine != nullptr);

			routine->func();

			routine->finished = true;
			ordinator.current = 0;

			cs::current_process = routine->this_context;
		}